

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

xml_parse_result * __thiscall
NULLCPugiXML::xml_document__load_file
          (NULLCPugiXML *this,NULLCArray name,uint options,xml_encoding encoding,
          xml_document *document)

{
  undefined4 in_register_00000084;
  xml_parse_result local_68;
  xml_parse_result *local_50;
  xml_parse_result *res;
  xml_document *doc;
  xml_document *document_local;
  uint local_30;
  xml_encoding encoding_local;
  uint options_local;
  undefined4 local_24;
  NULLCPugiXML *local_1c;
  NULLCArray name_local;
  
  doc = (xml_document *)CONCAT44(in_register_00000084,encoding);
  local_30 = name.len;
  local_24 = name.ptr._0_4_;
  document_local._4_4_ = options;
  _encoding_local = this;
  local_1c = this;
  name_local.ptr._0_4_ = local_24;
  if ((doc->super_xml_node)._root == (xml_node_struct *)0x0) {
    nullcThrowError("xml_document constructor wasn\'t called");
    name_local._4_8_ = 0;
  }
  else {
    res = (xml_parse_result *)((doc->super_xml_node)._root)->header;
    if (res == (xml_parse_result *)0x0) {
      res = (xml_parse_result *)nullcAllocate(0xd0);
      ((doc->super_xml_node)._root)->header = (uintptr_t)res;
      pugi::xml_document::xml_document((xml_document *)res);
    }
    local_50 = (xml_parse_result *)nullcAllocate(0xc);
    pugi::xml_document::load_file
              (&local_68,(xml_document *)res,(char *)local_1c,local_30,document_local._4_4_);
    xml_parse_result::operator=(local_50,&local_68);
    name_local._4_8_ = local_50;
  }
  return (xml_parse_result *)name_local._4_8_;
}

Assistant:

xml_parse_result* xml_document__load_file(NULLCArray name, unsigned int options, pugi::xml_encoding encoding, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return NULL; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			doc = document->impl->document = (pugi::xml_document*)nullcAllocate(sizeof(pugi::xml_document));
			::new(doc) pugi::xml_document();
		}
		xml_parse_result *res = (xml_parse_result*)nullcAllocate(sizeof(xml_parse_result));
		*res = doc->load_file(name.ptr, options, encoding);
		return res;
	}